

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

uint __thiscall QPDFWriter::bytesNeeded(QPDFWriter *this,longlong n)

{
  uint bytes;
  
  bytes = 0;
  for (; n != 0; n = n >> 8) {
    bytes = bytes + 1;
  }
  return bytes;
}

Assistant:

unsigned int
QPDFWriter::bytesNeeded(long long n)
{
    unsigned int bytes = 0;
    while (n) {
        ++bytes;
        n >>= 8;
    }
    return bytes;
}